

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O0

void __thiscall
CTxMemPoolEntry::UpdateAncestorState
          (CTxMemPoolEntry *this,int32_t modifySize,CAmount modifyFee,int64_t modifyCount,
          int64_t modifySigOps)

{
  long lVar1;
  long lVar2;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(long *)(in_RDI + 0xe8) = (long)in_ESI + *(long *)(in_RDI + 0xe8);
  if (*(long *)(in_RDI + 0xe8) < 1) {
    __assert_fail("nSizeWithAncestors > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txmempool.cpp"
                  ,0x188,
                  "void CTxMemPoolEntry::UpdateAncestorState(int32_t, CAmount, int64_t, int64_t)");
  }
  lVar2 = SaturatingAdd<long>(in_RDX,in_RCX);
  *(long *)(in_RDI + 0xf0) = lVar2;
  *(long *)(in_RDI + 0xe0) = in_RCX + *(long *)(in_RDI + 0xe0);
  if (*(long *)(in_RDI + 0xe0) < 1) {
    __assert_fail("m_count_with_ancestors > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txmempool.cpp"
                  ,0x18b,
                  "void CTxMemPoolEntry::UpdateAncestorState(int32_t, CAmount, int64_t, int64_t)");
  }
  *(long *)(in_RDI + 0xf8) = in_R8 + *(long *)(in_RDI + 0xf8);
  if ((int)*(undefined8 *)(in_RDI + 0xf8) < 0) {
    __assert_fail("int(nSigOpCostWithAncestors) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txmempool.cpp"
                  ,0x18d,
                  "void CTxMemPoolEntry::UpdateAncestorState(int32_t, CAmount, int64_t, int64_t)");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CTxMemPoolEntry::UpdateAncestorState(int32_t modifySize, CAmount modifyFee, int64_t modifyCount, int64_t modifySigOps)
{
    nSizeWithAncestors += modifySize;
    assert(nSizeWithAncestors > 0);
    nModFeesWithAncestors = SaturatingAdd(nModFeesWithAncestors, modifyFee);
    m_count_with_ancestors += modifyCount;
    assert(m_count_with_ancestors > 0);
    nSigOpCostWithAncestors += modifySigOps;
    assert(int(nSigOpCostWithAncestors) >= 0);
}